

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

void downsampleBy2(int16_t *in,size_t len,int16_t *out,int32_t *filtState)

{
  short sVar1;
  int16_t iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  short *psVar9;
  int local_68;
  int local_64;
  int32_t state7;
  int32_t state6;
  int32_t state5;
  int32_t state4;
  int32_t state3;
  int32_t state2;
  int32_t state1;
  int32_t state0;
  size_t i;
  int32_t out32;
  int32_t in32;
  int32_t diff;
  int32_t tmp2;
  int32_t tmp1;
  int32_t *filtState_local;
  int16_t *out_local;
  size_t len_local;
  int16_t *in_local;
  
  state5 = filtState[3];
  local_68 = filtState[7];
  local_64 = filtState[6];
  state7 = filtState[5];
  state6 = filtState[4];
  state4 = filtState[2];
  state3 = filtState[1];
  state2 = *filtState;
  filtState_local = (int32_t *)out;
  len_local = (size_t)in;
  for (_state1 = len >> 1; _state1 != 0; _state1 = _state1 - 1) {
    psVar9 = (short *)(len_local + 2);
    sVar1 = *(short *)len_local;
    uVar3 = sVar1 * 0x400 - state3;
    iVar4 = state2 + ((int)uVar3 >> 0x10) * 0x2fa7 + ((uVar3 & 0xffff) * 0x2fa7 >> 0x10);
    uVar3 = iVar4 - state4;
    iVar5 = state3 + ((int)uVar3 >> 0x10) * 0x925f + ((uVar3 & 0xffff) * 0x925f >> 0x10);
    uVar3 = iVar5 - state5;
    state5 = state4 + ((int)uVar3 >> 0x10) * 0xeb5f + ((uVar3 & 0xffff) * 0xeb5f >> 0x10);
    len_local = len_local + 4;
    iVar6 = *psVar9 * 0x400;
    uVar3 = iVar6 - state7;
    iVar7 = state6 + ((int)uVar3 >> 0x10) * 0xcd4 + ((uVar3 & 0xffff) * 0xcd4 >> 0x10);
    uVar3 = iVar7 - local_64;
    iVar8 = state7 + ((int)uVar3 >> 0x10) * 0x5f79 + ((uVar3 & 0xffff) * 0x5f79 >> 0x10);
    uVar3 = iVar8 - local_68;
    local_68 = local_64 + ((int)uVar3 >> 0x10) * 0xc178 + ((uVar3 & 0xffff) * 0xc178 >> 0x10);
    iVar2 = SatW32ToW16(state5 + local_68 + 0x400 >> 0xb);
    *(int16_t *)filtState_local = iVar2;
    local_64 = iVar8;
    state7 = iVar7;
    state6 = iVar6;
    state4 = iVar5;
    state3 = iVar4;
    state2 = sVar1 * 0x400;
    filtState_local = (int32_t *)((long)filtState_local + 2);
  }
  *filtState = state2;
  filtState[1] = state3;
  filtState[2] = state4;
  filtState[3] = state5;
  filtState[4] = state6;
  filtState[5] = state7;
  filtState[6] = local_64;
  filtState[7] = local_68;
  return;
}

Assistant:

static __inline void downsampleBy2(const int16_t *in, size_t len, int16_t *out, int32_t *filtState) {
    int32_t tmp1, tmp2, diff, in32, out32;
    size_t i;

    register int32_t state0 = filtState[0];
    register int32_t state1 = filtState[1];
    register int32_t state2 = filtState[2];
    register int32_t state3 = filtState[3];
    register int32_t state4 = filtState[4];
    register int32_t state5 = filtState[5];
    register int32_t state6 = filtState[6];
    register int32_t state7 = filtState[7];

    for (i = (len >> 1); i > 0; i--) {
        // lower allpass filter
        in32 = (int32_t) (*in++) * (1 << 10);
        diff = in32 - state1;
        tmp1 = ((state0) + ((diff) >> 16) * (kResampleAllpass2[0]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass2[0])) >> 16));
        state0 = in32;
        diff = tmp1 - state2;
        tmp2 = ((state1) + ((diff) >> 16) * (kResampleAllpass2[1]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass2[1])) >> 16));
        state1 = tmp1;
        diff = tmp2 - state3;
        state3 = ((state2) + ((diff) >> 16) * (kResampleAllpass2[2]) +
                  (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass2[2])) >> 16));
        state2 = tmp2;

        // upper allpass filter
        in32 = (int32_t) (*in++) * (1 << 10);
        diff = in32 - state5;
        tmp1 = ((state4) + ((diff) >> 16) * (kResampleAllpass1[0]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass1[0])) >> 16));

        state4 = in32;
        diff = tmp1 - state6;
        tmp2 = ((state5) + ((diff) >> 16) * (kResampleAllpass1[1]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass1[1])) >> 16));

        state5 = tmp1;
        diff = tmp2 - state7;
        state7 = ((state6) + ((diff) >> 16) * (kResampleAllpass1[2]) +
                  (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass1[2])) >> 16));

        state6 = tmp2;

        // add two allpass outputs, divide by two and round
        out32 = (state3 + state7 + 1024) >> 11;

        // limit amplitude to prevent wrap-around, and write to output array
        *out++ = SatW32ToW16(out32);
    }

    filtState[0] = state0;
    filtState[1] = state1;
    filtState[2] = state2;
    filtState[3] = state3;
    filtState[4] = state4;
    filtState[5] = state5;
    filtState[6] = state6;
    filtState[7] = state7;
}